

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O2

int __thiscall PFData::loadPQR(PFData *this)

{
  FILE *__stream;
  uint32_t uVar1;
  size_t sVar2;
  char *__s;
  int iVar3;
  int iVar4;
  int iVar5;
  int ny;
  int nz;
  uint32_t local_54;
  int local_50;
  int local_4c;
  fpos_t pos;
  
  pos.__pos = 0;
  pos.__state.__count = 0;
  pos.__state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  fgetpos((FILE *)this->m_fp,(fpos_t *)&pos);
  iVar4 = 0;
  fseek((FILE *)this->m_fp,0x4c,0);
  this->m_r = 0;
  this->m_q = 0;
  this->m_p = 0;
  iVar3 = 0;
  iVar5 = 0;
  do {
    if (this->m_numSubgrids <= iVar5) {
      fsetpos((FILE *)this->m_fp,(fpos_t *)&pos);
      return 0;
    }
    __stream = (FILE *)this->m_fp;
    local_50 = iVar3;
    local_4c = iVar4;
    sVar2 = fread(&local_54,4,1,__stream);
    __s = "Error reading nx in subgrid header";
    iVar4 = (int)sVar2;
    if (iVar4 == 1) {
      sVar2 = fread(&ny,4,1,__stream);
      __s = "Error reading ny in subgrid header";
      iVar4 = (int)sVar2;
      if (iVar4 != 1) goto LAB_0011b793;
      sVar2 = fread(&nz,4,1,__stream);
      __s = "Error reading nz in subgrid header";
      iVar4 = (int)sVar2;
      if (iVar4 != 1) goto LAB_0011b793;
      uVar1 = bswap32(local_54);
      ny = bswap32(ny);
      nz = bswap32(nz);
    }
    else {
LAB_0011b793:
      perror(__s);
      uVar1 = local_54;
      if (iVar4 != 0) {
        fsetpos((FILE *)this->m_fp,(fpos_t *)&pos);
        return iVar4;
      }
    }
    if (this->m_q == 0) {
      this->m_p = this->m_p + 1;
    }
    iVar3 = local_50 + uVar1;
    iVar4 = local_4c;
    if (iVar3 == this->m_nx) {
      iVar4 = local_4c + ny;
      this->m_q = this->m_q + 1;
      iVar3 = 0;
    }
    if (iVar4 == this->m_ny) {
      this->m_r = this->m_r + 1;
      iVar4 = 0;
    }
    if (iVar5 != this->m_numSubgrids + -1) {
      fseek((FILE *)this->m_fp,(long)nz * (long)ny * (long)(int)uVar1 * 8 + 0x18,1);
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

int PFData::loadPQR(){
    //Read nx, ny, nz from subgrid header.
    auto readValues = [](std::FILE* f, int& nx, int& ny, int& nz){
        int err = std::fread(&nx, 4, 1, f);
        if(err != 1){
            perror("Error reading nx in subgrid header");
            return err;
        }

        err = std::fread(&ny, 4, 1, f);
        if(err != 1){
            perror("Error reading ny in subgrid header");
            return err;
        }

        err = std::fread(&nz, 4, 1, f);
        if(err != 1){
            perror("Error reading nz in subgrid header");
            return err;
        }

        nx = bswap32(nx);
        ny = bswap32(ny);
        nz = bswap32(nz);

        return 0;
    };


    std::fpos_t pos{};
    //Save old position
    std::fgetpos(m_fp, &pos);
    std::fseek(m_fp, 64+12, SEEK_SET); //Skip file header and first 3 ints of the subgrid header.

    //Reset
    m_r = 0;
    m_q = 0;
    m_p = 0;

    int yDim{};
    int xDim{};


    //Each iter:
    //  if m_q == 0, m_p++
    //  Every time xDim == m_nx, add 1 to m_q
    //  Every time yDim == m_ny, add 1 to m_r

    for(int i = 0; i < m_numSubgrids; ++i){
        int nx, ny, nz;
        if(int err = readValues(m_fp, nx, ny, nz)){
            std::fsetpos(m_fp, &pos);
            return err;
        }

        xDim += nx;

        if(m_q == 0){
            m_p++;
        }

        if(xDim == m_nx){
            yDim += ny;     //Only increase y count once per row
            m_q++;
            xDim = 0;
        }

        if(yDim == m_ny){
            m_r++;
            yDim = 0;
        }

        if(i != m_numSubgrids-1){//Avoid skipping past end of file
            //Skip the last 3 ints of the subgrid header, the data, and the first 3 ints of the next subgrid header
            std::fseek(m_fp, 12+8*nx*ny*nz+12, SEEK_CUR);
        }

    }

    //Restore old position
    std::fsetpos(m_fp, &pos);
    return 0;
}